

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall chrono::robosimian::RoboSimian::SetCollide(RoboSimian *this,int flags)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer psVar3;
  RS_Limb *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer psVar4;
  
  peVar1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->super_RS_Part).field_0xec = (byte)flags & 1;
  chrono::ChBody::SetCollide
            (SUB81((peVar1->super_RS_Part).m_body.
                   super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  peVar2 = (this->m_sled).
           super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    (peVar2->super_RS_Part).field_0xec = (byte)((uint)flags >> 1) & 1;
    chrono::ChBody::SetCollide
              (SUB81((peVar2->super_RS_Part).m_body.
                     super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0))
    ;
  }
  psVar3 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = (this->m_limbs).
           super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar4 != psVar3) {
    do {
      this_00 = (psVar4->super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      this_01 = (psVar4->super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      RS_Limb::SetCollideLinks(this_00,SUB41((flags & 4U) >> 2,0));
      this_00->m_collide_wheel = SUB41((flags & 8U) >> 3,0);
      chrono::ChBody::SetCollide
                (SUB81((((this_00->m_wheel).
                         super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_body).
                       super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
                      ));
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar3);
  }
  return;
}

Assistant:

void RoboSimian::SetCollide(int flags) {
    m_chassis->SetCollide((flags & static_cast<int>(CollisionFlags::CHASSIS)) != 0);

    if (m_sled)
        m_sled->SetCollide((flags & static_cast<int>(CollisionFlags::SLED)) != 0);

    for (auto limb : m_limbs) {
        limb->SetCollideLinks((flags & static_cast<int>(CollisionFlags::LIMBS)) != 0);
        limb->SetCollideWheel((flags & static_cast<int>(CollisionFlags::WHEELS)) != 0);
    }
}